

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

void PaUtil_TerminateBufferProcessor(PaUtilBufferProcessor *bp)

{
  PaUtilBufferProcessor *bp_local;
  
  if (bp->tempInputBuffer != (void *)0x0) {
    PaUtil_FreeMemory(bp->tempInputBuffer);
  }
  if (bp->tempInputBufferPtrs != (void **)0x0) {
    PaUtil_FreeMemory(bp->tempInputBufferPtrs);
  }
  if (bp->hostInputChannels[0] != (PaUtilChannelDescriptor *)0x0) {
    PaUtil_FreeMemory(bp->hostInputChannels[0]);
  }
  if (bp->tempOutputBuffer != (void *)0x0) {
    PaUtil_FreeMemory(bp->tempOutputBuffer);
  }
  if (bp->tempOutputBufferPtrs != (void **)0x0) {
    PaUtil_FreeMemory(bp->tempOutputBufferPtrs);
  }
  if (bp->hostOutputChannels[0] != (PaUtilChannelDescriptor *)0x0) {
    PaUtil_FreeMemory(bp->hostOutputChannels[0]);
  }
  return;
}

Assistant:

void PaUtil_TerminateBufferProcessor( PaUtilBufferProcessor* bp )
{
    if( bp->tempInputBuffer )
        PaUtil_FreeMemory( bp->tempInputBuffer );

    if( bp->tempInputBufferPtrs )
        PaUtil_FreeMemory( bp->tempInputBufferPtrs );

    if( bp->hostInputChannels[0] )
        PaUtil_FreeMemory( bp->hostInputChannels[0] );
        
    if( bp->tempOutputBuffer )
        PaUtil_FreeMemory( bp->tempOutputBuffer );

    if( bp->tempOutputBufferPtrs )
        PaUtil_FreeMemory( bp->tempOutputBufferPtrs );

    if( bp->hostOutputChannels[0] )
        PaUtil_FreeMemory( bp->hostOutputChannels[0] );
}